

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O1

void __thiscall DLightFlash::Tick(DLightFlash *this)

{
  int *piVar1;
  byte bVar2;
  sector_t_conflict *psVar3;
  uint uVar4;
  short sVar5;
  int iVar6;
  int iVar7;
  
  piVar1 = &this->m_Count;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    return;
  }
  psVar3 = (this->super_DLighting).super_DSectorEffect.m_Sector;
  iVar6 = this->m_MaxLight;
  if (iVar6 == psVar3->lightlevel) {
    iVar6 = 0x7fff;
    if (this->m_MinLight < 0x7fff) {
      iVar6 = this->m_MinLight;
    }
    sVar5 = -0x8000;
    if (-0x8000 < iVar6) {
      sVar5 = (short)iVar6;
    }
    psVar3->lightlevel = sVar5;
    uVar4 = FRandom::GenRand32(&pr_lightflash);
    bVar2 = (byte)this->m_MinTime;
  }
  else {
    iVar7 = 0x7fff;
    if (iVar6 < 0x7fff) {
      iVar7 = iVar6;
    }
    sVar5 = -0x8000;
    if (-0x8000 < iVar7) {
      sVar5 = (short)iVar7;
    }
    psVar3->lightlevel = sVar5;
    uVar4 = FRandom::GenRand32(&pr_lightflash);
    bVar2 = (byte)this->m_MaxTime;
  }
  this->m_Count = (bVar2 & uVar4) + 1;
  return;
}

Assistant:

void DLightFlash::Tick ()
{
	if (--m_Count == 0)
	{
		if (m_Sector->lightlevel == m_MaxLight)
		{
			m_Sector->SetLightLevel(m_MinLight);
			m_Count = (pr_lightflash() & m_MinTime) + 1;
		}
		else
		{
			m_Sector->SetLightLevel(m_MaxLight);
			m_Count = (pr_lightflash() & m_MaxTime) + 1;
		}
	}
}